

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O3

Vec_Wec_t * Acec_MatchCopy(Vec_Wec_t *vLits,Vec_Int_t *vMap)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *__ptr;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int local_6c;
  
  iVar8 = vLits->nSize;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  local_6c = 8;
  if (6 < iVar8 - 1U) {
    local_6c = iVar8;
  }
  pVVar5->nCap = local_6c;
  if (local_6c == 0) {
    __ptr = (Vec_Int_t *)0x0;
  }
  else {
    __ptr = (Vec_Int_t *)calloc((long)local_6c,0x10);
  }
  pVVar5->pArray = __ptr;
  pVVar5->nSize = iVar8;
  if (0 < iVar8) {
    lVar6 = 0;
    iVar7 = iVar8;
    do {
      pVVar3 = vLits->pArray;
      if (0 < pVVar3[lVar6].nSize) {
        lVar10 = 0;
        do {
          uVar1 = pVVar3[lVar6].pArray[lVar10];
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x135,"int Abc_Lit2LitL(int *, int)");
          }
          uVar2 = vMap->pArray[uVar1 >> 1];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          if (iVar7 <= lVar6) {
            uVar4 = iVar7 * 2;
            iVar7 = (int)(lVar6 + 1U);
            uVar9 = (ulong)uVar4;
            if ((int)uVar4 <= iVar7) {
              uVar9 = lVar6 + 1U & 0xffffffff;
            }
            iVar8 = (int)uVar9;
            if (iVar8 - local_6c != 0 && local_6c <= iVar8) {
              if (__ptr == (Vec_Int_t *)0x0) {
                __ptr = (Vec_Int_t *)malloc(uVar9 << 4);
              }
              else {
                __ptr = (Vec_Int_t *)realloc(__ptr,uVar9 << 4);
              }
              pVVar5->pArray = __ptr;
              memset(__ptr + local_6c,0,(long)(iVar8 - local_6c) << 4);
              pVVar5->nCap = iVar8;
              local_6c = iVar8;
            }
            pVVar5->nSize = iVar7;
          }
          Vec_IntPush(__ptr + lVar6,uVar2 ^ uVar1 & 1);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar3[lVar6].nSize);
        iVar8 = vLits->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar8);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Acec_MatchCopy( Vec_Wec_t * vLits, Vec_Int_t * vMap )
{
    Vec_Wec_t * vRes = Vec_WecStart( Vec_WecSize(vLits) );
    Vec_Int_t * vLevel; int i, k, iLit;
    Vec_WecForEachLevel( vLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            Vec_WecPush( vRes, i, Abc_Lit2LitL(Vec_IntArray(vMap), iLit) );
    return vRes;
}